

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000179630 = 0x2e2e2e2e2e2e2e;
    uRam0000000000179637._0_1_ = '.';
    uRam0000000000179637._1_1_ = '.';
    uRam0000000000179637._2_1_ = '.';
    uRam0000000000179637._3_1_ = '.';
    uRam0000000000179637._4_1_ = '.';
    uRam0000000000179637._5_1_ = '.';
    uRam0000000000179637._6_1_ = '.';
    uRam0000000000179637._7_1_ = '.';
    DAT_00179620 = '.';
    DAT_00179620_1._0_1_ = '.';
    DAT_00179620_1._1_1_ = '.';
    DAT_00179620_1._2_1_ = '.';
    DAT_00179620_1._3_1_ = '.';
    DAT_00179620_1._4_1_ = '.';
    DAT_00179620_1._5_1_ = '.';
    DAT_00179620_1._6_1_ = '.';
    uRam0000000000179628 = 0x2e2e2e2e2e2e2e;
    DAT_0017962f = 0x2e;
    DAT_00179610 = '.';
    DAT_00179610_1._0_1_ = '.';
    DAT_00179610_1._1_1_ = '.';
    DAT_00179610_1._2_1_ = '.';
    DAT_00179610_1._3_1_ = '.';
    DAT_00179610_1._4_1_ = '.';
    DAT_00179610_1._5_1_ = '.';
    DAT_00179610_1._6_1_ = '.';
    uRam0000000000179618._0_1_ = '.';
    uRam0000000000179618._1_1_ = '.';
    uRam0000000000179618._2_1_ = '.';
    uRam0000000000179618._3_1_ = '.';
    uRam0000000000179618._4_1_ = '.';
    uRam0000000000179618._5_1_ = '.';
    uRam0000000000179618._6_1_ = '.';
    uRam0000000000179618._7_1_ = '.';
    DAT_00179600 = '.';
    DAT_00179600_1._0_1_ = '.';
    DAT_00179600_1._1_1_ = '.';
    DAT_00179600_1._2_1_ = '.';
    DAT_00179600_1._3_1_ = '.';
    DAT_00179600_1._4_1_ = '.';
    DAT_00179600_1._5_1_ = '.';
    DAT_00179600_1._6_1_ = '.';
    uRam0000000000179608._0_1_ = '.';
    uRam0000000000179608._1_1_ = '.';
    uRam0000000000179608._2_1_ = '.';
    uRam0000000000179608._3_1_ = '.';
    uRam0000000000179608._4_1_ = '.';
    uRam0000000000179608._5_1_ = '.';
    uRam0000000000179608._6_1_ = '.';
    uRam0000000000179608._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001795f8._0_1_ = '.';
    uRam00000000001795f8._1_1_ = '.';
    uRam00000000001795f8._2_1_ = '.';
    uRam00000000001795f8._3_1_ = '.';
    uRam00000000001795f8._4_1_ = '.';
    uRam00000000001795f8._5_1_ = '.';
    uRam00000000001795f8._6_1_ = '.';
    uRam00000000001795f8._7_1_ = '.';
    DAT_0017963f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }